

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

int sexp_maybe_block_port(sexp ctx,sexp in,int forcep)

{
  sexp psVar1;
  sexp psVar2;
  sexp_uint_t sVar3;
  sexp_conflict f;
  int iVar4;
  uint __c;
  long lVar5;
  int *piVar6;
  
  psVar1 = (in->value).type.getters;
  if (psVar1 == (sexp)0x0) {
    psVar1 = (in->value).type.slots;
    if (((ulong)psVar1 & 3) != 0) {
      return 0;
    }
    if (psVar1->tag != 0x12) {
      return 0;
    }
    psVar1 = (in->value).type.slots;
    lVar5 = -1;
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
      lVar5 = (psVar1->value).fileno.fd;
    }
  }
  else {
    iVar4 = fileno((FILE *)psVar1);
    lVar5 = (long)iVar4;
  }
  __c = 0;
  if (-1 < lVar5) {
    if ((in->value).type.finalize_name == (sexp)0xffffffffffffffff) {
      psVar1 = (in->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (in->value).type.slots;
        iVar4 = -1;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
          iVar4 = (psVar1->value).promise.donep;
        }
      }
      else {
        iVar4 = fileno((FILE *)psVar1);
      }
      iVar4 = fcntl(iVar4,3);
      *(long *)((long)&in->value + 0x40) = (long)iVar4;
    }
    if (((in->value).flonum_bits[0x41] & 8U) != 0) {
      if (forcep == 0) {
        psVar1 = (in->value).type.setters;
        if (psVar1 == (sexp)0x0) {
          __c = getc((FILE *)(in->value).type.getters);
        }
        else {
          psVar2 = (in->value).type.print;
          if (psVar2 < (sexp)(in->value).port.size) {
            (in->value).type.print = (sexp)((long)&psVar2->tag + 1);
            __c = (uint)*(byte *)((long)&psVar2->tag + (long)&psVar1->tag);
          }
          else {
            __c = sexp_buffered_read_char(ctx,in);
          }
        }
        if (__c == 0xffffffff) {
          psVar1 = (in->value).type.getters;
          __c = 0xffffffff;
          if (((psVar1 != (sexp)0x0) && (iVar4 = ferror((FILE *)psVar1), iVar4 != 0)) &&
             (piVar6 = __errno_location(), *piVar6 == 0xb)) {
            clearerr((FILE *)psVar1);
            f = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[0xc].start;
            if ((((ulong)f & 3) == 0) && ((f->tag == 0x1b || (f->tag == 0x14)))) {
              sexp_apply2(ctx,f,in,(sexp_conflict)&DAT_0000003e);
              return 1;
            }
          }
        }
      }
      if ((forcep == 0) && (__c != 0xffffffff)) {
        sVar3 = (in->value).bytecode.max_depth;
        if (sVar3 == 0) {
          ungetc(__c,(FILE *)(in->value).type.getters);
        }
        else {
          psVar1 = (in->value).type.print;
          (in->value).type.print = (sexp)((long)&psVar1[-1].value + 0x60bf);
          *(char *)((sVar3 - 1) + (long)psVar1) = (char)__c;
        }
      }
      (in->value).flonum_bits[0x2e] = '\x01';
      psVar1 = (in->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (in->value).type.slots;
        iVar4 = -1;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
          iVar4 = (psVar1->value).promise.donep;
        }
      }
      else {
        iVar4 = fileno((FILE *)psVar1);
      }
      fcntl(iVar4,4,(in->value).port.flags & 0xfffffffffffff7ff);
    }
  }
  return 0;
}

Assistant:

int sexp_maybe_block_port (sexp ctx, sexp in, int forcep) {
  sexp f;
  int c;
  if ((sexp_port_stream(in) || sexp_filenop(sexp_port_fd(in)))
      && sexp_port_fileno(in) >= 0) {
    if (sexp_port_flags(in) == SEXP_PORT_UNKNOWN_FLAGS)
      sexp_port_flags(in) = fcntl(sexp_port_fileno(in), F_GETFL);
    if (sexp_port_flags(in) & O_NONBLOCK) {
      if (!forcep
          && (((c = sexp_read_char(ctx, in)) == EOF)
              && sexp_port_stream(in)
              && (sexp_port_stream(in) ? ferror(sexp_port_stream(in)) : 1)
              && (errno == EAGAIN))) {
        if (sexp_port_stream(in))
          clearerr(sexp_port_stream(in));
        f = sexp_global(ctx, SEXP_G_THREADS_BLOCKER);
        if (sexp_applicablep(f)) {
          sexp_apply2(ctx, f, in, SEXP_FALSE);
          return 1;
        }
      }
      if (!forcep) sexp_push_char(ctx, c, in);
      sexp_port_blockedp(in) = 1;
      fcntl(sexp_port_fileno(in), F_SETFL, sexp_port_flags(in) & ~O_NONBLOCK);
    }
  }
  return 0;
}